

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

TRef recff_io_fp(jit_State *J,TRef *udp,int32_t id)

{
  IRRef1 IVar1;
  TRef TVar2;
  uint uVar3;
  TRef TVar4;
  int in_EDX;
  uint *in_RSI;
  jit_State *in_RDI;
  TRef fp;
  TRef ud;
  TRef tr;
  TraceError in_stack_ffffffffffffff6c;
  jit_State *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  undefined2 in_stack_ffffffffffffff7e;
  jit_State *in_stack_ffffffffffffff80;
  IROp in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  if (in_EDX == 0) {
    uVar3 = *in_RDI->base;
    if ((uVar3 & 0x1f000000) != 0xc000000) {
      lj_trace_err(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    }
    (in_RDI->fold).ins.field_0.ot = 0x4310;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)uVar3;
    (in_RDI->fold).ins.field_0.op2 = 10;
    TVar2 = lj_opt_fold((jit_State *)
                        CONCAT26(in_stack_ffffffffffffff7e,
                                 CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
    IVar1 = (IRRef1)TVar2;
    in_stack_ffffffffffffff80 = in_RDI;
    TVar2 = lj_ir_kint(in_RDI,CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
    (in_stack_ffffffffffffff80->fold).ins.field_0.ot = 0x893;
    (in_stack_ffffffffffffff80->fold).ins.field_0.op1 = IVar1;
    (in_stack_ffffffffffffff80->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold((jit_State *)
                CONCAT26(in_stack_ffffffffffffff7e,
                         CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
  }
  else {
    TVar2 = lj_ir_kptr_((jit_State *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80);
    (in_RDI->fold).ins.field_0.ot = 0x440c;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (in_RDI->fold).ins.field_0.op2 = 0;
    uVar3 = lj_opt_fold((jit_State *)
                        CONCAT26(in_stack_ffffffffffffff7e,
                                 CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
  }
  *in_RSI = uVar3;
  (in_RDI->fold).ins.field_0.ot = 0x4309;
  (in_RDI->fold).ins.field_0.op1 = (IRRef1)uVar3;
  (in_RDI->fold).ins.field_0.op2 = 0xb;
  TVar2 = lj_opt_fold((jit_State *)
                      CONCAT26(in_stack_ffffffffffffff7e,
                               CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
  IVar1 = (IRRef1)TVar2;
  TVar4 = lj_ir_knull(in_stack_ffffffffffffff80,CONCAT22(IVar1,in_stack_ffffffffffffff7c));
  (in_RDI->fold).ins.field_0.ot = 0x989;
  (in_RDI->fold).ins.field_0.op1 = IVar1;
  (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
  lj_opt_fold((jit_State *)
              CONCAT26(IVar1,CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
  return TVar2;
}

Assistant:

static TRef recff_io_fp(jit_State *J, TRef *udp, int32_t id)
{
  TRef tr, ud, fp;
  if (id) {  /* io.func() */
    tr = lj_ir_kptr(J, &J2G(J)->gcroot[id]);
    ud = emitir(IRT(IR_XLOAD, IRT_UDATA), tr, 0);
  } else {  /* fp:method() */
    ud = J->base[0];
    if (!tref_isudata(ud))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    tr = emitir(IRT(IR_FLOAD, IRT_U8), ud, IRFL_UDATA_UDTYPE);
    emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, UDTYPE_IO_FILE));
  }
  *udp = ud;
  fp = emitir(IRT(IR_FLOAD, IRT_PTR), ud, IRFL_UDATA_FILE);
  emitir(IRTG(IR_NE, IRT_PTR), fp, lj_ir_knull(J, IRT_PTR));
  return fp;
}